

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

void param_help(void)

{
  char *pcVar1;
  long lVar2;
  char param_names [73] [32];
  char param_comments [73] [128];
  char local_2dc8 [2336];
  undefined1 local_24a8 [9352];
  
  pcVar1 = local_2dc8;
  memcpy(local_2dc8,"VERSION",0x920);
  memcpy(local_24a8,"Parameter file version",0x2480);
  fprintf(_stderr,"INFO: Comments of parameters (parameter version %.1f)\n\n",0x4010000000000000);
  for (lVar2 = 0; lVar2 != 0x2480; lVar2 = lVar2 + 0x80) {
    if (*pcVar1 != '_') {
      fprintf(_stderr,"  %20s: %s\n",pcVar1,local_24a8 + lVar2);
    }
    pcVar1 = pcVar1 + 0x20;
  }
  return;
}

Assistant:

void param_help(void)
{
  int i;
  char param_names[YP_PARAM_NUM][32] = YP_PARAM_NAME;
  char param_comments[YP_PARAM_NUM][128] = YP_PARAM_COMMENT;

  fprintf(stderr, "INFO: Comments of parameters (parameter version %.1f)\n\n", YP_PARAM_REQUIRED_VERSION);
  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    if (param_names[i][0] == '_')
      continue;
    fprintf(stderr, "  %20s: %s\n", param_names[i], param_comments[i]);
  }
}